

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

bool __thiscall ChainstateManager::IsInitialBlockDownload(ChainstateManager *this)

{
  uint uVar1;
  long lVar2;
  pointer ppCVar3;
  CBlockIndex *pCVar4;
  bool bVar5;
  Chainstate *pCVar6;
  base_uint<256U> *b;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tVar7;
  bool bVar8;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock10;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->m_cached_finished_ibd)._M_base._M_i & 1U) == 0) {
    bVar8 = false;
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (&criticalblock10,&cs_main,"cs_main",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
               ,0x7cc,false);
    if (((((this->m_cached_finished_ibd)._M_base._M_i & 1U) == 0) &&
        (bVar8 = true, ((this->m_blockman).m_importing._M_base._M_i & 1U) == 0)) &&
       (((this->m_blockman).m_blockfiles_indexed._M_base._M_i & 1U) != 0)) {
      pCVar6 = ActiveChainstate(this);
      ppCVar3 = (pCVar6->m_chain).vChain.
                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if ((ppCVar3 !=
           (pCVar6->m_chain).vChain.
           super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
           super__Vector_impl_data._M_start) && (pCVar4 = ppCVar3[-1], pCVar4 != (CBlockIndex *)0x0)
         ) {
        b = &MinimumChainWork(this)->super_base_uint<256U>;
        bVar5 = ::operator<(&(pCVar4->nChainWork).super_base_uint<256U>,b);
        if (!bVar5) {
          uVar1 = (pCVar6->m_chain).vChain.
                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1]->nTime;
          tVar7 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                            ();
          if ((long)tVar7.__d.__r - (this->m_options).max_tip_age.__r <= (long)(ulong)uVar1) {
            source_file._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
            ;
            source_file._M_len = 0x5e;
            logging_function._M_str = "IsInitialBlockDownload";
            logging_function._M_len = 0x16;
            LogPrintFormatInternal<>
                      (logging_function,source_file,0x7dc,ALL,Info,
                       (ConstevalFormatString<0U>)0xcd0f06);
            (this->m_cached_finished_ibd)._M_base._M_i = true;
            bVar8 = false;
          }
        }
      }
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock10.super_unique_lock);
  }
  else {
    bVar8 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return bVar8;
  }
  __stack_chk_fail();
}

Assistant:

bool ChainstateManager::IsInitialBlockDownload() const
{
    // Optimization: pre-test latch before taking the lock.
    if (m_cached_finished_ibd.load(std::memory_order_relaxed))
        return false;

    LOCK(cs_main);
    if (m_cached_finished_ibd.load(std::memory_order_relaxed))
        return false;
    if (m_blockman.LoadingBlocks()) {
        return true;
    }
    CChain& chain{ActiveChain()};
    if (chain.Tip() == nullptr) {
        return true;
    }
    if (chain.Tip()->nChainWork < MinimumChainWork()) {
        return true;
    }
    if (chain.Tip()->Time() < Now<NodeSeconds>() - m_options.max_tip_age) {
        return true;
    }
    LogPrintf("Leaving InitialBlockDownload (latching to false)\n");
    m_cached_finished_ibd.store(true, std::memory_order_relaxed);
    return false;
}